

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O0

void __thiscall
serial::IOException::IOException(IOException *this,string *file,int line,char *description)

{
  ostream *poVar1;
  string local_1e0 [32];
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [392];
  char *local_28;
  char *description_local;
  string *psStack_18;
  int line_local;
  string *file_local;
  IOException *this_local;
  
  local_28 = description;
  description_local._4_4_ = line;
  psStack_18 = file;
  file_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__IOException_0011fd50;
  std::__cxx11::string::string((string *)&this->file_,(string *)file);
  this->line_ = description_local._4_4_;
  std::__cxx11::string::string((string *)&this->e_what_);
  this->errno_ = 0;
  std::__cxx11::stringstream::stringstream(local_1c0);
  poVar1 = std::operator<<(local_1b0,"IO Exception: ");
  std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(local_1b0,", file ");
  poVar1 = std::operator<<(poVar1,(string *)&this->file_);
  poVar1 = std::operator<<(poVar1,", line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->line_);
  std::operator<<(poVar1,".");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

explicit IOException (std::string file, int line, const char * description)
    : file_(file), line_(line), errno_(0) {
      std::stringstream ss;
      ss << "IO Exception: " << description;
      ss << ", file " << file_ << ", line " << line_ << ".";
      e_what_ = ss.str();
  }